

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> * __thiscall
pstore::dump::number_base::write_decimal<unsigned_long_long,std::ostream>
          (number_base *this,unsigned_long_long value,
          basic_ostream<char,_std::char_traits<char>_> *os)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  ostream *poVar4;
  long lVar5;
  uint uVar6;
  ostream *poVar7;
  
  lVar5 = *(long *)(*(long *)os + -0x18);
  poVar7 = os + lVar5 + 0x18;
  uVar1 = *(uint *)poVar7;
  uVar6 = this->base_;
  uVar2 = uVar1;
  if (uVar6 == 8) {
    if (value != 0) {
      std::operator<<(os,"0");
      lVar5 = *(long *)(*(long *)os + -0x18);
      uVar2 = *(uint *)(os + lVar5 + 0x18);
    }
    poVar4 = os + lVar5;
    uVar6 = 0x40;
  }
  else {
    if (uVar6 == 10) {
      uVar6 = 2;
      poVar4 = poVar7;
      goto LAB_001745ed;
    }
    if (uVar6 != 0x10) {
      assert_failed("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/dump/value.hpp"
                    ,0xa3);
    }
    poVar3 = std::operator<<(os,"0x");
    poVar4 = poVar3 + *(long *)(*(long *)poVar3 + -0x18);
    uVar2 = *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18);
    uVar6 = 8;
  }
  poVar4 = poVar4 + 0x18;
LAB_001745ed:
  *(uint *)poVar4 = uVar2 & 0xffffffb5 | uVar6;
  poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)os);
  *(uint *)poVar7 = uVar1;
  return poVar4;
}

Assistant:

OStream & write_decimal (T value, OStream & os) const {
                ios_flags_saver const _{os};
                switch (base_) {
                case 16: os << "0x" << std::hex; break;
                case 8:
                    if (value != 0) {
                        os << "0";
                    }
                    os << std::oct;
                    break;
                case 10: os << std::dec; break;
                default: PSTORE_ASSERT (0); break;
                }
                return os << value;
            }